

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

void __thiscall
HighsCutGeneration::updateViolationAndNorm
          (HighsCutGeneration *this,HighsInt index,double aj,double *violation,double *norm)

{
  pointer pdVar1;
  
  pdVar1 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *violation = pdVar1[index] * aj + *violation;
  if (((aj <= 0.0) || (this->feastol < pdVar1[index])) &&
     ((0.0 <= aj ||
      (pdVar1[index] <
       (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[index] - this->feastol)))) {
    *norm = aj * aj + *norm;
  }
  return;
}

Assistant:

void HighsCutGeneration::updateViolationAndNorm(HighsInt index, double aj,
                                                double& violation,
                                                double& norm) const {
  // update violation
  violation += aj * solval[index];

  // update norm
  if (aj > 0 && solval[index] <= feastol) return;
  if (aj < 0 && solval[index] >= upper[index] - feastol) return;
  norm += aj * aj;
}